

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_Decoder_AddMessageSetItem
               (upb_Decoder *d,upb_Message *msg,upb_MiniTable *t,uint32_t type_id,char *data,
               uint32_t size)

{
  upb_MiniTableExtension *item_mt_00;
  upb_MiniTableExtension *item_mt;
  uint32_t size_local;
  char *data_local;
  uint32_t type_id_local;
  upb_MiniTable *t_local;
  upb_Message *msg_local;
  upb_Decoder *d_local;
  
  item_mt_00 = upb_ExtensionRegistry_Lookup(d->extreg,t,type_id);
  if (item_mt_00 == (upb_MiniTableExtension *)0x0) {
    upb_Decoder_AddUnknownMessageSetItem(d,msg,type_id,data,size);
  }
  else {
    upb_Decoder_AddKnownMessageSetItem(d,msg,item_mt_00,data,size);
  }
  return;
}

Assistant:

static void upb_Decoder_AddMessageSetItem(upb_Decoder* d, upb_Message* msg,
                                          const upb_MiniTable* t,
                                          uint32_t type_id, const char* data,
                                          uint32_t size) {
  const upb_MiniTableExtension* item_mt =
      upb_ExtensionRegistry_Lookup(d->extreg, t, type_id);
  if (item_mt) {
    upb_Decoder_AddKnownMessageSetItem(d, msg, item_mt, data, size);
  } else {
    upb_Decoder_AddUnknownMessageSetItem(d, msg, type_id, data, size);
  }
}